

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

bool __thiscall Spi::eraseFlash(Spi *this)

{
  FILE *pFVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  timespec local_38;
  
  fwrite("reset..\n",8,1,_stdout);
  set_gpio(this,1,0);
  local_38.tv_sec = 0;
  local_38.tv_nsec = 250000000;
  do {
    iVar3 = nanosleep(&local_38,&local_38);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  pFVar1 = _stdout;
  send_byte(this,0x81);
  bVar2 = recv_byte(this);
  pcVar6 = "high";
  pcVar5 = "high";
  if ((bVar2 & 0x40) == 0) {
    pcVar5 = "low";
  }
  fprintf(pFVar1,"cdone: %s\n",pcVar5);
  flash_reset(this);
  flash_power_up(this);
  flash_read_id(this);
  flash_write_enable(this);
  flash_bulk_erase(this);
  flash_wait(this);
  flash_power_down(this);
  set_gpio(this,1,1);
  local_38.tv_sec = 0;
  local_38.tv_nsec = 250000000;
  do {
    iVar3 = nanosleep(&local_38,&local_38);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  pFVar1 = _stdout;
  send_byte(this,0x81);
  bVar2 = recv_byte(this);
  if ((bVar2 & 0x40) == 0) {
    pcVar6 = "low";
  }
  fprintf(pFVar1,"cdone: %s\n",pcVar6);
  return true;
}

Assistant:

bool Spi::eraseFlash() {
	fprintf(stdout, "reset..\n");

	flash_chip_deselect();
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	fprintf(stdout, "cdone: %s\n", get_cdone() ? "high" : "low");

	flash_reset();
	flash_power_up();

	flash_read_id();

	flash_write_enable();
	flash_bulk_erase();
	flash_wait();

	// ---------------------------------------------------------
	// Reset
	// ---------------------------------------------------------

	flash_power_down();

	set_gpio(1, 1);
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	fprintf(stdout, "cdone: %s\n", get_cdone() ? "high" : "low");

	return true;
}